

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O1

QRect __thiscall
QMainWindowLayout::dockWidgetAreaRect
          (QMainWindowLayout *this,DockWidgetArea area,DockWidgetAreaSize size)

{
  int iVar1;
  int *piVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  bool bVar6;
  QDebug this_00;
  QLoggingCategory *pQVar7;
  long lVar8;
  DockPosition dockPos;
  QArrayDataPointer<QDockAreaLayoutItem> *this_01;
  long in_FS_OFFSET;
  QRect QVar9;
  QByteArrayView QVar10;
  QDebug local_288;
  QDebug local_280;
  QDebug local_278;
  QDebug local_270 [3];
  undefined1 local_258 [24];
  char *pcStack_240;
  QLayoutItem *local_238;
  QMainWindow *pQStack_230;
  QRect local_228;
  undefined8 local_218 [5];
  undefined8 auStack_1f0 [45];
  QArrayDataPointer<QDockAreaLayoutItem> local_88 [2];
  int local_58;
  QMainWindowLayout local_54;
  QArrayData *local_50;
  QWidget **local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = false;
  dockPos = LeftDock;
  switch(area) {
  case LeftDockWidgetArea:
    goto switchD_0043aadd_caseD_1;
  case RightDockWidgetArea:
    dockPos = RightDock;
    break;
  default:
    dockPos = DockCount;
    bVar6 = true;
    goto switchD_0043aadd_caseD_1;
  case TopDockWidgetArea:
    dockPos = TopDock;
    break;
  case BottomDockWidgetArea:
    dockPos = BottomDock;
  }
  bVar6 = false;
switchD_0043aadd_caseD_1:
  if (bVar6) {
    pQVar7 = QtPrivateLogging::lcQpaDockWidgets();
    if (((pQVar7->field_2).bools.enabledDebug._q_value._M_base._M_i & 1U) != 0) {
      pcStack_240 = pQVar7->name;
      local_258._0_4_ = RightDockWidgetArea;
      local_258._4_4_ = NoDockWidgetArea;
      local_258._8_4_ = NoDockWidgetArea;
      local_258._12_4_ = NoDockWidgetArea;
      local_258._16_4_ = 0;
      local_258._20_4_ = 0;
      QMessageLogger::debug();
      this_00.stream = local_288.stream;
      QVar10.m_data = (storage_type *)0x31;
      QVar10.m_size = (qsizetype)local_270;
      QString::fromUtf8(QVar10);
      QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_270);
      if ((QArrayData *)local_270[0].stream != (QArrayData *)0x0) {
        LOCK();
        *(int *)local_270[0].stream = *(int *)local_270[0].stream + -1;
        UNLOCK();
        if (*(int *)local_270[0].stream == 0) {
          QArrayData::deallocate((QArrayData *)local_270[0].stream,2,0x10);
        }
      }
      if ((char)(((QArrayData *)(local_288.stream + 0x30))->ref_)._q_value.super___atomic_base<int>.
                _M_i == '\x01') {
        QTextStream::operator<<((QTextStream *)local_288.stream,' ');
      }
      local_280.stream = local_288.stream;
      iVar1 = *(int *)(local_288.stream + 0x28);
      *(int *)(local_288.stream + 0x28) = iVar1 + 1;
      local_270[0].stream = local_288.stream;
      *(int *)(local_288.stream + 0x28) = iVar1 + 2;
      qt_QMetaEnum_flagDebugOperator
                (&local_278,(ulonglong)local_270,(QMetaObject *)(ulong)area,
                 (char *)&Qt::staticMetaObject);
      QDebug::~QDebug(local_270);
      QDebug::~QDebug(&local_278);
      QDebug::~QDebug(&local_280);
      QDebug::~QDebug(&local_288);
    }
    QVar9 = (QRect)(ZEXT816(0xffffffffffffffff) << 0x40);
  }
  else {
    memset(local_218,0xaa,0x1e0);
    pcStack_240 = *(char **)(this + 0x1b8);
    local_238 = *(QLayoutItem **)(this + 0x1c0);
    pQStack_230 = *(QMainWindow **)(this + 0x1c8);
    local_228._0_8_ = *(undefined8 *)(this + 0x1d0);
    local_228._8_8_ = *(undefined8 *)(this + 0x1d8);
    local_258._0_4_ = (undefined4)*(undefined8 *)(this + 0x1a0);
    local_258._4_4_ = (undefined4)((ulong)*(undefined8 *)(this + 0x1a0) >> 0x20);
    local_258._8_4_ = (undefined4)*(undefined8 *)(this + 0x1a8);
    local_258._12_4_ = (undefined4)((ulong)*(undefined8 *)(this + 0x1a8) >> 0x20);
    local_258._16_4_ = (undefined4)*(undefined8 *)(this + 0x1b0);
    local_258._20_4_ = (undefined4)((ulong)*(undefined8 *)(this + 0x1b0) >> 0x20);
    lVar8 = 0x40;
    do {
      *(undefined8 *)(local_258 + lVar8) = *(undefined8 *)(this + lVar8 + 0x1a0);
      piVar2 = *(int **)(this + lVar8 + 0x1a8);
      *(int **)(local_258 + lVar8 + 8) = piVar2;
      *(undefined8 *)(local_258 + lVar8 + 0x10) = *(undefined8 *)(this + lVar8 + 0x1b0);
      *(undefined8 *)((long)&pcStack_240 + lVar8) = *(undefined8 *)(this + lVar8 + 0x1b8);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      uVar3 = *(undefined8 *)(this + lVar8 + 0x1c0);
      uVar4 = *(undefined8 *)(this + lVar8 + 0x1c0 + 8);
      uVar5 = *(undefined8 *)(this + lVar8 + 0x1d0 + 8);
      *(undefined8 *)((long)&local_228.x1.m_i + lVar8) = *(undefined8 *)(this + lVar8 + 0x1d0);
      *(undefined8 *)((long)local_218 + lVar8 + -8) = uVar5;
      *(undefined8 *)((long)&local_238 + lVar8) = uVar3;
      *(undefined8 *)((long)&pQStack_230 + lVar8) = uVar4;
      piVar2 = *(int **)(this + lVar8 + 0x1e0);
      *(int **)((long)local_218 + lVar8) = piVar2;
      *(undefined8 *)((long)local_218 + lVar8 + 8) = *(undefined8 *)(this + lVar8 + 0x1e8);
      *(undefined8 *)((long)local_218 + lVar8 + 0x10) = *(undefined8 *)(this + lVar8 + 0x1f0);
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + 1;
        UNLOCK();
      }
      *(undefined4 *)((long)auStack_1f0 + lVar8) = *(undefined4 *)(this + lVar8 + 0x208);
      uVar3 = *(undefined8 *)(this + lVar8 + 0x1f8 + 8);
      *(undefined8 *)((long)local_218 + lVar8 + 0x18) = *(undefined8 *)(this + lVar8 + 0x1f8);
      *(undefined8 *)((long)local_218 + lVar8 + 0x20) = uVar3;
      lVar8 = lVar8 + 0x70;
    } while (lVar8 != 0x200);
    local_54 = this[0x3a4];
    local_58 = *(int *)(this + 0x3a0);
    local_50 = *(QArrayData **)(this + 0x3a8);
    local_48 = *(QWidget ***)(this + 0x3b0);
    local_40 = *(qsizetype *)(this + 0x3b8);
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    if (size == Maximum) {
      QVar9 = QDockAreaLayout::gapRect((QDockAreaLayout *)local_258,dockPos);
    }
    else {
      QVar9._8_8_ = auStack_1f0[(ulong)dockPos * 0xe + 1];
      QVar9._0_8_ = auStack_1f0[(ulong)dockPos * 0xe];
    }
    if (local_50 != (QArrayData *)0x0) {
      LOCK();
      (local_50->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_50->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_50->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_50,8,0x10);
      }
    }
    lVar8 = -0x1c0;
    this_01 = local_88;
    do {
      QArrayDataPointer<QDockAreaLayoutItem>::~QArrayDataPointer(this_01);
      piVar2 = (int *)this_01[-3].size;
      if (piVar2 != (int *)0x0) {
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          QArrayData::deallocate((QArrayData *)this_01[-3].size,8,0x10);
        }
      }
      this_01 = (QArrayDataPointer<QDockAreaLayoutItem> *)&this_01[-5].ptr;
      lVar8 = lVar8 + 0x70;
    } while (lVar8 != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar9;
  }
  __stack_chk_fail();
}

Assistant:

QRect QMainWindowLayout::dockWidgetAreaRect(const Qt::DockWidgetArea area, DockWidgetAreaSize size) const
{
    const QInternal::DockPosition dockPosition = toDockPos(area);

    // Called with invalid dock widget area
    if (dockPosition == QInternal::DockCount) {
        qCDebug(lcQpaDockWidgets) << "QMainWindowLayout::dockWidgetAreaRect called with" << area;
        return QRect();
    }

    const QDockAreaLayout dl = layoutState.dockAreaLayout;

    // Return maximum or visible rectangle
    return (size == Maximum) ? dl.gapRect(dockPosition) : dl.docks[dockPosition].rect;
}